

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O0

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::core::engine::DataManWriter::PopBufferQueue(DataManWriter *this)

{
  bool bVar1;
  reference this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar2;
  lock_guard<std::mutex> l;
  value_type *ret;
  mutex_type *in_stack_ffffffffffffffa8;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *in_stack_ffffffffffffffb0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = std::
          queue<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>_>
          ::empty((queue<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>_>
                   *)0xe41237);
  if (bVar1) {
    std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::shared_ptr
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    this_00 = std::
              queue<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>_>
              ::front((queue<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>_>
                       *)0xe4128b);
    std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::shared_ptr
              (this_00,(shared_ptr<std::vector<char,_std::allocator<char>_>_> *)
                       in_stack_ffffffffffffffa8);
    std::
    queue<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>_>
    ::pop((queue<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>_>
           *)0xe412b2);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xe412fa);
  sVar2.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar2.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> DataManWriter::PopBufferQueue()
{
    std::lock_guard<std::mutex> l(m_BufferQueueMutex);
    if (m_BufferQueue.empty())
    {
        return nullptr;
    }
    else
    {
        auto ret = m_BufferQueue.front();
        m_BufferQueue.pop();
        return ret;
    }
}